

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread_POSIX.c
# Opt level: O0

void OSThread_Cancel(OS_THREAD *thr)

{
  int iVar1;
  int retVal;
  OS_THREAD *thr_local;
  
  if ((thr->id != 0) && (iVar1 = pthread_cancel(thr->id), iVar1 == 0)) {
    thr->id = 0;
  }
  return;
}

Assistant:

void OSThread_Cancel(OS_THREAD* thr)
{
	int retVal;
	
	if (! thr->id)
		return;
	
	retVal = pthread_cancel(thr->id);
	if (! retVal)
		thr->id = 0;	// stopped successfully
	
	return;
}